

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O1

void __thiscall
disruptor::test::BusySpinStrategy::WaitForDependents::test_method(WaitForDependents *this)

{
  atomic<long> *paVar1;
  __atomic_base<long> local_160;
  undefined8 *local_158;
  __atomic_base<long> *local_150;
  undefined **local_148;
  undefined1 local_140;
  undefined8 *local_138;
  __atomic_base<long> **local_130;
  atomic<long> return_value;
  thread waiter;
  shared_count sStack_e8;
  char *local_e0;
  char *local_d8;
  undefined **local_d0;
  undefined1 local_c8;
  undefined8 *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  return_value.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  waiter._M_id._M_thread = (id)0;
  local_148 = (undefined **)operator_new(0x18);
  *local_148 = (undefined *)&PTR___State_0011c708;
  local_148[1] = (undefined *)this;
  local_148[2] = (undefined *)&return_value;
  std::thread::_M_start_thread(&waiter,&local_148,0);
  if (local_148 != (undefined **)0x0) {
    (**(code **)(*local_148 + 8))();
  }
  LOCK();
  paVar1 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).cursor.sequence_;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x6c);
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_0011ccc8;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_150 = &local_160;
  local_160 = return_value.super___atomic_base<long>._M_i;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_d8 = "";
  local_130 = &local_150;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_0011cd40;
  local_138 = &boost::unit_test::lazy_ostream::inst;
  local_158 = &kInitialCursorValue;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_e8);
  LOCK();
  paVar1 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).sequence_1.sequence_;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x6f);
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_0011ccc8;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_160 = return_value.super___atomic_base<long>._M_i;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_d8 = "";
  local_150 = &local_160;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_0011cd40;
  local_138 = &boost::unit_test::lazy_ostream::inst;
  local_130 = &local_150;
  local_158 = &kInitialCursorValue;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_e8);
  LOCK();
  paVar1 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).sequence_2.sequence_;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x72);
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_0011ccc8;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_160 = return_value.super___atomic_base<long>._M_i;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_d8 = "";
  local_150 = &local_160;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_0011cd40;
  local_138 = &boost::unit_test::lazy_ostream::inst;
  local_130 = &local_150;
  local_158 = &kInitialCursorValue;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_e8);
  LOCK();
  paVar1 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).sequence_3.sequence_;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  std::thread::join();
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x76);
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_0011ccc8;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_160 = return_value.super___atomic_base<long>._M_i;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_d8 = "";
  local_150 = &local_160;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_0011cd40;
  local_138 = &boost::unit_test::lazy_ostream::inst;
  local_130 = &local_150;
  local_158 = &kFirstSequenceValue;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_e8);
  if (waiter._M_id._M_thread == 0) {
    return;
  }
  std::terminate();
}

Assistant:

BOOST_AUTO_TEST_CASE(WaitForDependents) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor,
                                        allDependents(), alerted));
  });

  cursor.IncrementAndGet(1L);
  strategy.SignalAllWhenBlocking();
  // dependents haven't moved, WaitFor() should still block.
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_1.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_2.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_3.IncrementAndGet(1L);
  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);
}